

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlregexp.c
# Opt level: O3

void xmlRegexpPrint(FILE *output,xmlRegexpPtr regexp)

{
  int iVar1;
  xmlRegAtomPtr pxVar2;
  xmlRegRangePtr pxVar3;
  xmlRegStatePtr pxVar4;
  xmlRegTrans *pxVar5;
  xmlRegQuantType xVar6;
  xmlRegAtomType xVar7;
  xmlRegStateType xVar8;
  uint *puVar9;
  size_t sVar10;
  char *pcVar11;
  ulong uVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  
  if (output != (FILE *)0x0) {
    fwrite(" regexp: ",9,1,(FILE *)output);
    if (regexp == (xmlRegexpPtr)0x0) {
      fwrite("NULL\n",5,1,(FILE *)output);
      return;
    }
    fprintf((FILE *)output,"\'%s\' ",regexp->string);
    fputc(10,(FILE *)output);
    fprintf((FILE *)output,"%d atoms:\n",(ulong)(uint)regexp->nbAtoms);
    if (0 < regexp->nbAtoms) {
      uVar12 = 0;
      do {
        fprintf((FILE *)output," %02d ",uVar12 & 0xffffffff);
        pxVar2 = regexp->atoms[uVar12];
        fwrite(" atom: ",7,1,(FILE *)output);
        if (pxVar2 == (xmlRegAtomPtr)0x0) {
          fwrite("NULL\n",5,1,(FILE *)output);
        }
        else {
          if (pxVar2->neg != 0) {
            fwrite("not ",4,1,(FILE *)output);
          }
          xmlRegPrintAtomType(output,pxVar2->type);
          xVar6 = pxVar2->quant;
          switch(xVar6) {
          case XML_REGEXP_QUANT_EPSILON:
            sVar10 = 8;
            pcVar11 = "epsilon ";
            break;
          case XML_REGEXP_QUANT_ONCE:
            sVar10 = 5;
            pcVar11 = "once ";
            break;
          case XML_REGEXP_QUANT_OPT:
            sVar10 = 2;
            pcVar11 = "? ";
            break;
          case XML_REGEXP_QUANT_MULT:
            sVar10 = 2;
            pcVar11 = "* ";
            break;
          case XML_REGEXP_QUANT_PLUS:
            sVar10 = 2;
            pcVar11 = "+ ";
            break;
          case XML_REGEXP_QUANT_ONCEONLY:
            sVar10 = 9;
            pcVar11 = "onceonly ";
            break;
          case XML_REGEXP_QUANT_ALL:
            sVar10 = 4;
            pcVar11 = "all ";
            break;
          case XML_REGEXP_QUANT_RANGE:
            sVar10 = 6;
            pcVar11 = "range ";
            break;
          default:
            goto switchD_0017bce5_default;
          }
          fwrite(pcVar11,sVar10,1,(FILE *)output);
          xVar6 = pxVar2->quant;
switchD_0017bce5_default:
          if (xVar6 == XML_REGEXP_QUANT_RANGE) {
            fprintf((FILE *)output,"%d-%d ",(ulong)(uint)pxVar2->min,(ulong)(uint)pxVar2->max);
          }
          xVar7 = pxVar2->type;
          if (xVar7 == XML_REGEXP_STRING) {
            fprintf((FILE *)output,"\'%s\' ",pxVar2->valuep);
            xVar7 = pxVar2->type;
          }
          if (xVar7 == XML_REGEXP_SUBREG) {
            fprintf((FILE *)output,"start %d end %d\n",(ulong)(uint)pxVar2->start->no,
                    (ulong)(uint)pxVar2->stop->no);
          }
          else if (xVar7 == XML_REGEXP_RANGES) {
            fprintf((FILE *)output,"%d entries\n",(ulong)(uint)pxVar2->nbRanges);
            if (0 < pxVar2->nbRanges) {
              lVar15 = 0;
              do {
                pxVar3 = pxVar2->ranges[lVar15];
                fwrite("  range: ",9,1,(FILE *)output);
                if (pxVar3->neg != 0) {
                  fwrite("negative ",9,1,(FILE *)output);
                }
                xmlRegPrintAtomType(output,pxVar3->type);
                fprintf((FILE *)output,"%c - %c\n",(ulong)(uint)pxVar3->start,
                        (ulong)(uint)pxVar3->end);
                lVar15 = lVar15 + 1;
              } while (lVar15 < pxVar2->nbRanges);
            }
          }
          else if (xVar7 == XML_REGEXP_CHARVAL) {
            fprintf((FILE *)output,"char %c\n",(ulong)(uint)pxVar2->codepoint);
          }
          else {
            fputc(10,(FILE *)output);
          }
        }
        uVar12 = uVar12 + 1;
      } while ((long)uVar12 < (long)regexp->nbAtoms);
    }
    fprintf((FILE *)output,"%d states:",(ulong)(uint)regexp->nbStates);
    fputc(10,(FILE *)output);
    if (0 < regexp->nbStates) {
      lVar15 = 0;
      do {
        pxVar4 = regexp->states[lVar15];
        fwrite(" state: ",8,1,(FILE *)output);
        if (pxVar4 == (xmlRegStatePtr)0x0) {
          fwrite("NULL\n",5,1,(FILE *)output);
        }
        else {
          xVar8 = pxVar4->type;
          if (xVar8 == XML_REGEXP_START_STATE) {
            fwrite("START ",6,1,(FILE *)output);
            xVar8 = pxVar4->type;
          }
          if (xVar8 == XML_REGEXP_FINAL_STATE) {
            fwrite("FINAL ",6,1,(FILE *)output);
          }
          fprintf((FILE *)output,"%d, %d transitions:\n",(ulong)(uint)pxVar4->no,
                  (ulong)(uint)pxVar4->nbTrans);
          if (0 < pxVar4->nbTrans) {
            lVar13 = 0;
            lVar14 = 0;
            do {
              pxVar5 = pxVar4->trans;
              fwrite("  trans: ",9,1,(FILE *)output);
              if (pxVar5 == (xmlRegTrans *)0x0) {
                sVar10 = 5;
                pcVar11 = "NULL\n";
LAB_0017c023:
                fwrite(pcVar11,sVar10,1,(FILE *)output);
              }
              else {
                if (*(int *)((long)&pxVar5->to + lVar13) < 0) {
                  sVar10 = 8;
                  pcVar11 = "removed\n";
                  goto LAB_0017c023;
                }
                iVar1 = *(int *)((long)&pxVar5->nd + lVar13);
                if (iVar1 != 0) {
                  if (iVar1 == 2) {
                    sVar10 = 0x16;
                    pcVar11 = "last not determinist, ";
                  }
                  else {
                    sVar10 = 0x11;
                    pcVar11 = "not determinist, ";
                  }
                  fwrite(pcVar11,sVar10,1,(FILE *)output);
                }
                if (-1 < *(int *)((long)&pxVar5->counter + lVar13)) {
                  fprintf((FILE *)output,"counted %d, ");
                }
                iVar1 = *(int *)((long)&pxVar5->count + lVar13);
                if (iVar1 == 0x123456) {
                  fwrite("all transition, ",0x10,1,(FILE *)output);
                }
                else if (-1 < iVar1) {
                  fprintf((FILE *)output,"count based %d, ");
                }
                puVar9 = *(uint **)((long)&pxVar5->atom + lVar13);
                if (puVar9 == (uint *)0x0) {
                  fprintf((FILE *)output,"epsilon to %d\n",
                          (ulong)*(uint *)((long)&pxVar5->to + lVar13));
                }
                else {
                  if (puVar9[1] == 2) {
                    fprintf((FILE *)output,"char %c ",(ulong)puVar9[0xb]);
                    puVar9 = *(uint **)((long)&pxVar5->atom + lVar13);
                  }
                  fprintf((FILE *)output,"atom %d, to %d\n",(ulong)*puVar9,
                          (ulong)*(uint *)((long)&pxVar5->to + lVar13));
                }
              }
              lVar14 = lVar14 + 1;
              lVar13 = lVar13 + 0x18;
            } while (lVar14 < pxVar4->nbTrans);
          }
        }
        lVar15 = lVar15 + 1;
      } while (lVar15 < regexp->nbStates);
    }
    fprintf((FILE *)output,"%d counters:\n",(ulong)(uint)regexp->nbCounters);
    if (0 < regexp->nbCounters) {
      uVar12 = 0;
      do {
        fprintf((FILE *)output," %d: min %d max %d\n",uVar12 & 0xffffffff,
                (ulong)(uint)regexp->counters[uVar12].min,(ulong)(uint)regexp->counters[uVar12].max)
        ;
        uVar12 = uVar12 + 1;
      } while ((long)uVar12 < (long)regexp->nbCounters);
    }
  }
  return;
}

Assistant:

void
xmlRegexpPrint(FILE *output, xmlRegexpPtr regexp) {
    int i;

    if (output == NULL)
        return;
    fprintf(output, " regexp: ");
    if (regexp == NULL) {
	fprintf(output, "NULL\n");
	return;
    }
    fprintf(output, "'%s' ", regexp->string);
    fprintf(output, "\n");
    fprintf(output, "%d atoms:\n", regexp->nbAtoms);
    for (i = 0;i < regexp->nbAtoms; i++) {
	fprintf(output, " %02d ", i);
	xmlRegPrintAtom(output, regexp->atoms[i]);
    }
    fprintf(output, "%d states:", regexp->nbStates);
    fprintf(output, "\n");
    for (i = 0;i < regexp->nbStates; i++) {
	xmlRegPrintState(output, regexp->states[i]);
    }
    fprintf(output, "%d counters:\n", regexp->nbCounters);
    for (i = 0;i < regexp->nbCounters; i++) {
	fprintf(output, " %d: min %d max %d\n", i, regexp->counters[i].min,
		                                regexp->counters[i].max);
    }
}